

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O2

uint llvm::dwarf::OperationVersion(LocationAtom Op)

{
  uint uVar1;
  
  uVar1 = 0;
  if (Op - DW_OP_addr < 0xa7) {
    uVar1 = *(uint *)(&DAT_00e75510 + (ulong)(Op - DW_OP_addr) * 4);
  }
  return uVar1;
}

Assistant:

unsigned llvm::dwarf::OperationVersion(dwarf::LocationAtom Op) {
  switch (Op) {
  default:
    return 0;
#define HANDLE_DW_OP(ID, NAME, VERSION, VENDOR)                                \
  case DW_OP_##NAME:                                                           \
    return VERSION;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}